

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ossl_new_session_cb(SSL *ssl,SSL_SESSION *ssl_sessionid)

{
  _Bool _Var1;
  CURLcode CVar2;
  Curl_cfilter *local_70;
  Curl_cfilter *local_68;
  char *local_60;
  SSL_SESSION *local_58;
  void *old_ssl_sessionid;
  _Bool added;
  _Bool incache;
  char *pcStack_48;
  _Bool isproxy;
  ssl_connect_data *connssl;
  ssl_config_data *config;
  Curl_cfilter *cf;
  Curl_easy *data;
  SSL_SESSION *pSStack_20;
  int res;
  SSL_SESSION *ssl_sessionid_local;
  SSL *ssl_local;
  
  data._4_4_ = 0;
  pSStack_20 = ssl_sessionid;
  ssl_sessionid_local = (SSL_SESSION *)ssl;
  config = (ssl_config_data *)SSL_get_ex_data((SSL *)ssl,0);
  if (config == (ssl_config_data *)0x0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = (config->primary).issuercert;
  }
  pcStack_48 = local_60;
  if (local_60 == (char *)0x0) {
    local_70 = (Curl_cfilter *)0x0;
  }
  else {
    if (config == (ssl_config_data *)0x0) {
      local_68 = (Curl_cfilter *)0x0;
    }
    else {
      local_68 = *(Curl_cfilter **)((config->primary).issuercert + 0x38);
    }
    local_70 = local_68;
  }
  cf = local_70;
  if ((config == (ssl_config_data *)0x0) || (local_70 == (Curl_cfilter *)0x0)) {
    ssl_local._4_4_ = 0;
  }
  else {
    old_ssl_sessionid._7_1_ = Curl_ssl_cf_is_proxy((Curl_cfilter *)config);
    connssl = (ssl_connect_data *)Curl_ssl_cf_get_config((Curl_cfilter *)config,(Curl_easy *)cf);
    if (((byte)(((ssl_config_data *)connssl)->primary).field_0x69 >> 3 & 1) != 0) {
      old_ssl_sessionid._5_1_ = 0;
      local_58 = (SSL_SESSION *)0x0;
      Curl_ssl_sessionid_lock((Curl_easy *)cf);
      if ((old_ssl_sessionid._7_1_ & 1) == 0) {
        _Var1 = Curl_ssl_getsessionid
                          ((Curl_cfilter *)config,(Curl_easy *)cf,&local_58,(size_t *)0x0);
        old_ssl_sessionid._6_1_ = (_Var1 ^ 0xffU) & 1;
      }
      else {
        old_ssl_sessionid._6_1_ = 0;
      }
      if ((old_ssl_sessionid._6_1_ != 0) && (local_58 != pSStack_20)) {
        if ((cf != (Curl_cfilter *)0x0) && ((*(ulong *)((long)&cf[0x42].cft + 2) >> 0x1c & 1) != 0))
        {
          Curl_infof((Curl_easy *)cf,"old SSL session ID is stale, removing");
        }
        Curl_ssl_delsessionid((Curl_easy *)cf,local_58);
        old_ssl_sessionid._6_1_ = 0;
      }
      if (old_ssl_sessionid._6_1_ == 0) {
        CVar2 = Curl_ssl_addsessionid
                          ((Curl_cfilter *)config,(Curl_easy *)cf,pSStack_20,0,
                           (_Bool *)((long)&old_ssl_sessionid + 5));
        if (CVar2 == CURLE_OK) {
          if ((old_ssl_sessionid._5_1_ & 1) != 0) {
            data._4_4_ = 1;
          }
        }
        else {
          Curl_failf((Curl_easy *)cf,"failed to store ssl session");
        }
      }
      Curl_ssl_sessionid_unlock((Curl_easy *)cf);
    }
    ssl_local._4_4_ = data._4_4_;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ossl_new_session_cb(SSL *ssl, SSL_SESSION *ssl_sessionid)
{
  int res = 0;
  struct Curl_easy *data;
  struct Curl_cfilter *cf;
  const struct ssl_config_data *config;
  struct ssl_connect_data *connssl;
  bool isproxy;

  cf = (struct Curl_cfilter*) SSL_get_app_data(ssl);
  connssl = cf? cf->ctx : NULL;
  data = connssl? CF_DATA_CURRENT(cf) : NULL;
  /* The sockindex has been stored as a pointer to an array element */
  if(!cf || !data)
    return 0;

  isproxy = Curl_ssl_cf_is_proxy(cf);

  config = Curl_ssl_cf_get_config(cf, data);
  if(config->primary.sessionid) {
    bool incache;
    bool added = FALSE;
    void *old_ssl_sessionid = NULL;

    Curl_ssl_sessionid_lock(data);
    if(isproxy)
      incache = FALSE;
    else
      incache = !(Curl_ssl_getsessionid(cf, data, &old_ssl_sessionid, NULL));
    if(incache) {
      if(old_ssl_sessionid != ssl_sessionid) {
        infof(data, "old SSL session ID is stale, removing");
        Curl_ssl_delsessionid(data, old_ssl_sessionid);
        incache = FALSE;
      }
    }

    if(!incache) {
      if(!Curl_ssl_addsessionid(cf, data, ssl_sessionid,
                                0 /* unknown size */, &added)) {
        if(added) {
          /* the session has been put into the session cache */
          res = 1;
        }
      }
      else
        failf(data, "failed to store ssl session");
    }
    Curl_ssl_sessionid_unlock(data);
  }

  return res;
}